

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  uint uVar1;
  string *value1;
  pointer ppSVar2;
  pointer ppMVar3;
  pointer ppEVar4;
  bool bVar5;
  long *plVar6;
  FileDescriptor *pFVar7;
  pointer ppMVar8;
  pointer ppEVar9;
  pointer ppEVar10;
  size_type *psVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  unsigned_long i;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long i_00;
  int index;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  string dependency;
  string local_90;
  string header;
  string local_50;
  
  bVar5 = IsWellKnownMessage(this->file_);
  StripProto(&dependency,*(string **)this->file_);
  plVar6 = (long *)std::__cxx11::string::append((char *)&dependency);
  header._M_dataplus._M_p = (pointer)&header.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    header.field_2._M_allocated_capacity = *psVar11;
    header.field_2._8_8_ = plVar6[3];
  }
  else {
    header.field_2._M_allocated_capacity = *psVar11;
    header._M_dataplus._M_p = (pointer)*plVar6;
  }
  header._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependency._M_dataplus._M_p != &dependency.field_2) {
    operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
  }
  value1 = *(string **)this->file_;
  pcVar16 = "<";
  pcVar17 = "\"";
  if (!bVar5) {
    pcVar16 = "\"";
  }
  dependency._M_dataplus._M_p = (pointer)&dependency.field_2;
  pcVar13 = "";
  pcVar18 = "";
  if (!bVar5) {
    pcVar13 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&dependency,pcVar16,pcVar13);
  if (bVar5) {
    pcVar17 = ">";
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  if (bVar5) {
    pcVar18 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar17,pcVar18);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include $left$$header$$right$\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/port.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",value1,"header",&header,"left",&dependency,"right",&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependency._M_dataplus._M_p != &dependency.field_2) {
    operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
  }
  if ((((this->options_).enforce_lite != false) ||
      (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) == 3)) &&
     ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    io::Printer::Print(printer,"#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
  }
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  if (((this->options_).proto_h == true) && (pFVar7 = this->file_, 0 < *(int *)(pFVar7 + 0x18))) {
    index = 0;
    do {
      pFVar7 = FileDescriptor::dependency(pFVar7,index);
      StripProto(&local_90,*(string **)pFVar7);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      dependency._M_dataplus._M_p = (pointer)&dependency.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        dependency.field_2._M_allocated_capacity = *psVar11;
        dependency.field_2._8_8_ = plVar6[3];
      }
      else {
        dependency.field_2._M_allocated_capacity = *psVar11;
        dependency._M_dataplus._M_p = (pointer)*plVar6;
      }
      dependency._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(printer,"#include \"$dependency$\"\n","dependency",&dependency);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependency._M_dataplus._M_p != &dependency.field_2) {
        operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      pFVar7 = this->file_;
    } while (index < *(int *)(pFVar7 + 0x18));
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,printer);
  ppMVar8 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar8) {
    uVar15 = 0;
    do {
      dependency._M_dataplus._M_p = (pointer)&dependency.field_2;
      dependency._M_string_length = 0;
      dependency.field_2._M_allocated_capacity =
           dependency.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (*(char *)(*(long *)(ppMVar8[uVar15]->descriptor_ + 0x20) + 0x6b) == '\x01') {
        ClassName_abi_cxx11_
                  (&local_50,*(cpp **)(ppMVar8[uVar15]->descriptor_ + 0x18),(Descriptor *)0x0,
                   SUB81(*(long *)(ppMVar8[uVar15]->descriptor_ + 0x20),0));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_90.field_2._M_allocated_capacity = *psVar11;
          local_90.field_2._8_8_ = plVar6[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar11;
          local_90._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_90._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&dependency,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      io::Printer::Print(printer,
                         "class $classname$DefaultTypeInternal : public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> {\n"
                         ,"parent",&dependency,"classname",
                         &(this->message_generators_).
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]->classname_);
      io::Printer::Indent(printer);
      MessageGenerator::GenerateExtraDefaultFields
                ((this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"} _$classname$_default_instance_;\n","classname",
                         &(this->message_generators_).
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]->classname_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependency._M_dataplus._M_p != &dependency.field_2) {
        operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
      ppMVar8 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar8 >> 3)
            );
  }
  ppEVar9 = (this->enum_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->enum_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar9;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar14 = 0;
    do {
      ppEVar9[lVar14]->index_in_metadata_ = (int)lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
  }
  pFVar7 = this->file_;
  if ((((0 < *(int *)(pFVar7 + 0x78)) && ((this->options_).enforce_lite == false)) &&
      (*(int *)(*(long *)(pFVar7 + 0xa0) + 0xa8) != 3)) &&
     (*(char *)(*(long *)(pFVar7 + 0xa0) + 0xa3) == '\x01')) {
    ppSVar2 = (this->service_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(this->service_generators_).
                   super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2;
    if (lVar12 != 0) {
      lVar12 = lVar12 >> 3;
      lVar14 = 0;
      do {
        ppSVar2[lVar14]->index_in_metadata_ = (int)lVar14;
        lVar14 = lVar14 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
    }
  }
  FileLevelNamespace(&dependency,*(string **)pFVar7);
  io::Printer::Print(printer,"\nnamespace $file_namespace$ {\n\n","file_namespace",&dependency);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependency._M_dataplus._M_p != &dependency.field_2) {
    operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
  }
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,"\nnamespace {\n\n");
    ppMVar8 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar3 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    i_00 = i;
    if (ppMVar8 != ppMVar3) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)((long)ppMVar3 - (long)ppMVar8 >> 3),i);
      io::Printer::Print(printer,"::google::protobuf::Metadata file_level_metadata[$size$];\n",
                         "size",&dependency);
      i_00 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependency._M_dataplus._M_p != &dependency.field_2) {
        operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
        i_00 = extraout_RDX_00;
      }
    }
    ppEVar9 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar9 != ppEVar4) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)((long)ppEVar4 - (long)ppEVar9 >> 3),i_00);
      io::Printer::Print(printer,
                         "const ::google::protobuf::EnumDescriptor* file_level_enum_descriptors[$size$];\n"
                         ,"size",&dependency);
      i_00 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependency._M_dataplus._M_p != &dependency.field_2) {
        operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
        i_00 = extraout_RDX_02;
      }
    }
    uVar1 = *(uint *)(this->file_ + 0x78);
    if (((0 < (int)uVar1) && ((this->options_).enforce_lite == false)) &&
       ((lVar12 = *(long *)(this->file_ + 0xa0), *(int *)(lVar12 + 0xa8) != 3 &&
        ((0 < (int)uVar1 && (*(char *)(lVar12 + 0xa3) != '\0')))))) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)(ulong)uVar1,(int)i_00);
      io::Printer::Print(printer,
                         "const ::google::protobuf::ServiceDescriptor* file_level_service_descriptors[$size$];\n"
                         ,"size",&dependency);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependency._M_dataplus._M_p != &dependency.field_2) {
        operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
      }
    }
    io::Printer::Print(printer,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this,printer);
  FileLevelNamespace(&dependency,*(string **)this->file_);
  io::Printer::Print(printer,"\n}  // namespace $file_namespace$\n\n","file_namespace",&dependency);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependency._M_dataplus._M_p != &dependency.field_2) {
    operator_delete(dependency._M_dataplus._M_p,dependency.field_2._M_allocated_capacity + 1);
  }
  ppEVar9 = (this->enum_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->enum_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar9) {
    uVar15 = 0;
    do {
      EnumGenerator::GenerateMethods(ppEVar9[uVar15],printer);
      uVar15 = uVar15 + 1;
      ppEVar9 = (this->enum_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->enum_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar9 >> 3)
            );
  }
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar15 = 0;
    do {
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      MessageGenerator::GenerateClassMethods
                ((this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],printer);
      io::Printer::Print(printer,"#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
      MessageGenerator::GenerateInlineMethods
                ((this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],printer,false);
      io::Printer::Print(printer,"#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((((0 < *(int *)(this->file_ + 0x78)) && ((this->options_).enforce_lite == false)) &&
      (lVar12 = *(long *)(this->file_ + 0xa0), *(int *)(lVar12 + 0xa8) != 3)) &&
     ((*(char *)(lVar12 + 0xa3) == '\x01' &&
      ((this->service_generators_).
       super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (this->service_generators_).
       super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
    uVar15 = 0;
    do {
      if (uVar15 == 0) {
        io::Printer::Print(printer,"\n");
      }
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      ServiceGenerator::GenerateImplementation
                ((this->service_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],printer);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(this->service_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->service_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppEVar10 = (this->extension_generators_).
             super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extension_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar10) {
    uVar15 = 0;
    do {
      ExtensionGenerator::GenerateDefinition(ppEVar10[uVar15],printer);
      uVar15 = uVar15 + 1;
      ppEVar10 = (this->extension_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->extension_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10 >> 3
                             ));
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header._M_dataplus._M_p != &header.field_2) {
    operator_delete(header._M_dataplus._M_p,header.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  const bool use_system_include = IsWellKnownMessage(file_);
  string header =
      StripProto(file_->name()) + (options_.proto_h ? ".proto.h" : ".pb.h");
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include $left$$header$$right$\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/port.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "header", header,
    "left", use_system_include ? "<" : "\"",
    "right", use_system_include ? ">" : "\"");

  // Unknown fields implementation in lite mode uses StringOutputStream
  if (!UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    printer->Print(
      "#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
  }

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  if (options_.proto_h) {
    // Use the smaller .proto.h files.
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor* dep = file_->dependency(i);
      const char* extension = ".proto.h";
      string dependency = StripProto(dep->name()) + extension;
      printer->Print(
          "#include \"$dependency$\"\n",
          "dependency", dependency);
    }
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  for (int i = 0; i < message_generators_.size(); i++) {
    string parent;
    if (IsMapEntryMessage(message_generators_[i]->descriptor_)) {
      parent = ClassName(message_generators_[i]->descriptor_->containing_type(),
                         false) +
               "::";
    }
    printer->Print(
        "class $classname$DefaultTypeInternal : "
        "public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> "
        "{\n",
        "parent", parent, "classname", message_generators_[i]->classname_);
    printer->Indent();
    message_generators_[i]->GenerateExtraDefaultFields(printer);
    printer->Outdent();
    printer->Print(
        "} _$classname$_default_instance_;\n",
        "classname", message_generators_[i]->classname_);
  }

  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->index_in_metadata_ = i;
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }

  printer->Print(
      "\n"
      "namespace $file_namespace$ {\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");

    if (!message_generators_.empty()) {
      printer->Print("::google::protobuf::Metadata file_level_metadata[$size$];\n",
                     "size", SimpleItoa(message_generators_.size()));
    }
    if (!enum_generators_.empty()) {
      printer->Print(
          "const ::google::protobuf::EnumDescriptor* "
          "file_level_enum_descriptors[$size$];\n",
          "size", SimpleItoa(enum_generators_.size()));
    }
    if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
      printer->Print(
          "const ::google::protobuf::ServiceDescriptor* "
          "file_level_service_descriptors[$size$];\n",
          "size", SimpleItoa(file_->service_count()));
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  printer->Print(
      "\n"
      "}  // namespace $file_namespace$\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  // Generate enums.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);

    printer->Print("#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
    // Generate class inline methods.
    message_generators_[i]->GenerateInlineMethods(printer,
                                                  /* is_inline = */ false);
    printer->Print("#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
  }

  if (HasGenericServices(file_, options_)) {
    // Generate services.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}